

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteSInt64
               (int field_number,int64 value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  if (uVar6 < 0x80) {
    *pbVar2 = (byte)uVar6;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar6 | 0x80;
    if (uVar6 < 0x4000) {
      pbVar2[1] = (byte)(uVar6 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar1);
      *pbVar3 = (byte)uVar4;
    }
  }
  output->cur_ = pbVar2;
  uVar7 = value >> 0x3f ^ value * 2;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  if (uVar7 < 0x80) {
    *pbVar2 = (byte)uVar7;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar7 | 0x80;
    if (uVar7 < 0x4000) {
      pbVar2[1] = (byte)(uVar7 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar7 | 0x80;
        uVar5 = uVar7 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar1);
      *pbVar3 = (byte)uVar5;
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

void WireFormatLite::WriteSInt64(int field_number, int64 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt64NoTag(value, output);
}